

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_concat(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_type gVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  size_t sVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  long lVar17;
  size_t sVar18;
  long lVar19;
  size_t sVar20;
  size_t sVar21;
  size_t sVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  size_t __n;
  long lVar26;
  undefined2 *puVar27;
  undefined4 *puVar28;
  char *pcVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  void *__src;
  undefined8 uVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  undefined1 *puVar38;
  undefined2 *puVar39;
  undefined4 *puVar40;
  long local_190;
  long local_188;
  long local_180;
  long local_170;
  long local_168;
  long local_160;
  long local_148;
  long local_138;
  long local_98 [5];
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  size_t local_50;
  size_t local_48;
  long local_40;
  size_t local_38;
  
  pgVar2 = dst->src[0];
  gVar1 = pgVar2->type;
  switch(gVar1) {
  case GGML_TYPE_I8:
    pgVar3 = dst->src[1];
    lVar24 = ggml_type_size(0x18);
    if (lVar24 == 1) {
      uVar23 = (ulong)(uint)dst->op_params[0];
      if (uVar23 < 4) {
        lVar26 = (long)params->ith;
        lVar30 = (long)params->nth;
        lVar24 = dst->ne[0];
        sVar4 = dst->nb[0];
        sVar5 = pgVar2->nb[3];
        sVar6 = pgVar3->nb[2];
        lVar8 = pgVar2->ne[2];
        lVar10 = pgVar2->ne[3];
        sVar7 = pgVar2->nb[1];
        sVar9 = pgVar3->nb[1];
        lVar11 = pgVar2->ne[0];
        lVar12 = pgVar2->ne[1];
        sVar14 = pgVar3->nb[0];
        lVar13 = dst->ne[1];
        sVar15 = pgVar3->nb[3];
        sVar16 = pgVar2->nb[0];
        sVar18 = pgVar2->nb[2];
        lVar17 = dst->ne[2];
        sVar20 = dst->nb[1];
        lVar19 = dst->ne[3];
        sVar21 = dst->nb[2];
        sVar22 = dst->nb[3];
        local_98[0] = 0;
        local_98[1] = 0;
        local_98[2] = 0;
        local_98[3] = 0;
        local_98[uVar23] = pgVar2->ne[uVar23];
        if (lVar19 < 1) {
          return;
        }
        lVar36 = 0;
        local_190 = sVar21 * lVar26;
        local_188 = sVar18 * lVar26;
        do {
          if (lVar26 < lVar17) {
            local_180 = local_190;
            local_170 = local_188;
            lVar25 = lVar26;
            do {
              if (0 < lVar13) {
                lVar34 = 0;
                local_160 = local_180;
                local_168 = local_170;
                do {
                  if (0 < lVar24) {
                    lVar37 = 0;
                    lVar31 = local_160;
                    lVar35 = local_168;
                    do {
                      if ((((lVar37 < lVar11) && (lVar34 < lVar12)) && (lVar25 < lVar8)) &&
                         (lVar36 < lVar10)) {
                        puVar38 = (undefined1 *)((long)pgVar2->data + lVar35);
                      }
                      else {
                        puVar38 = (undefined1 *)
                                  ((long)pgVar3->data +
                                  (lVar34 - local_98[1]) * sVar9 + (lVar25 - local_98[2]) * sVar6 +
                                  (lVar36 - local_98[3]) * sVar15 + (lVar37 - local_98[0]) * sVar14)
                        ;
                      }
                      lVar37 = lVar37 + 1;
                      lVar35 = lVar35 + sVar16;
                      *(undefined1 *)((long)dst->data + lVar31) = *puVar38;
                      lVar31 = lVar31 + sVar4;
                    } while (lVar24 != lVar37);
                  }
                  lVar34 = lVar34 + 1;
                  local_168 = local_168 + sVar7;
                  local_160 = local_160 + sVar20;
                } while (lVar34 != lVar13);
              }
              lVar25 = lVar25 + lVar30;
              local_170 = local_170 + sVar18 * lVar30;
              local_180 = local_180 + sVar21 * lVar30;
            } while (lVar25 < lVar17);
          }
          lVar36 = lVar36 + 1;
          local_188 = local_188 + sVar5;
          local_190 = local_190 + sVar22;
        } while (lVar36 != lVar19);
        return;
      }
      pcVar29 = "dim >= 0 && dim < 4";
      uVar33 = 0x99e;
    }
    else {
      pcVar29 = "ggml_type_size(src0->type) == sizeof(int8_t)";
      uVar33 = 0x995;
    }
    break;
  case GGML_TYPE_I32:
switchD_001385ad_caseD_1a:
    pgVar3 = dst->src[1];
    lVar24 = ggml_type_size();
    if (lVar24 == 4) {
      uVar23 = (ulong)(uint)dst->op_params[0];
      if (uVar23 < 4) {
        lVar26 = (long)params->ith;
        lVar30 = (long)params->nth;
        lVar24 = dst->ne[0];
        sVar4 = dst->nb[0];
        sVar5 = pgVar3->nb[2];
        sVar6 = pgVar3->nb[1];
        sVar7 = pgVar2->nb[3];
        lVar8 = pgVar2->ne[3];
        sVar9 = pgVar2->nb[1];
        lVar10 = dst->ne[1];
        lVar11 = pgVar2->ne[0];
        lVar12 = pgVar2->ne[1];
        lVar13 = pgVar2->ne[2];
        sVar14 = pgVar2->nb[0];
        sVar15 = pgVar3->nb[0];
        sVar16 = pgVar3->nb[3];
        lVar17 = dst->ne[3];
        sVar18 = pgVar2->nb[2];
        lVar19 = dst->ne[2];
        sVar20 = dst->nb[1];
        sVar21 = dst->nb[2];
        sVar22 = dst->nb[3];
        local_98[0] = 0;
        local_98[1] = 0;
        local_98[2] = 0;
        local_98[3] = 0;
        local_98[uVar23] = pgVar2->ne[uVar23];
        if (lVar17 < 1) {
          return;
        }
        lVar36 = 0;
        local_190 = sVar21 * lVar26;
        local_188 = sVar18 * lVar26;
        do {
          if (lVar26 < lVar19) {
            local_180 = local_190;
            local_170 = local_188;
            lVar25 = lVar26;
            do {
              if (0 < lVar10) {
                lVar34 = 0;
                local_160 = local_180;
                local_168 = local_170;
                do {
                  if (0 < lVar24) {
                    lVar35 = 0;
                    puVar40 = (undefined4 *)((long)dst->data + local_160);
                    lVar31 = local_168;
                    do {
                      if (((lVar35 < lVar11) && (lVar34 < lVar12)) &&
                         ((lVar25 < lVar13 && (lVar36 < lVar8)))) {
                        puVar28 = (undefined4 *)((long)pgVar2->data + lVar31);
                      }
                      else {
                        puVar28 = (undefined4 *)
                                  ((long)pgVar3->data +
                                  (lVar34 - local_98[1]) * sVar6 + (lVar25 - local_98[2]) * sVar5 +
                                  (lVar36 - local_98[3]) * sVar16 + (lVar35 - local_98[0]) * sVar15)
                        ;
                      }
                      lVar35 = lVar35 + 1;
                      lVar31 = lVar31 + sVar14;
                      *puVar40 = *puVar28;
                      puVar40 = (undefined4 *)((long)puVar40 + sVar4);
                    } while (lVar24 != lVar35);
                  }
                  lVar34 = lVar34 + 1;
                  local_168 = local_168 + sVar9;
                  local_160 = local_160 + sVar20;
                } while (lVar34 != lVar10);
              }
              lVar25 = lVar25 + lVar30;
              local_170 = local_170 + sVar18 * lVar30;
              local_180 = local_180 + sVar21 * lVar30;
            } while (lVar25 < lVar19);
          }
          lVar36 = lVar36 + 1;
          local_188 = local_188 + sVar7;
          local_190 = local_190 + sVar22;
        } while (lVar36 != lVar17);
        return;
      }
      pcVar29 = "dim >= 0 && dim < 4";
      uVar33 = 0x9f4;
    }
    else {
      pcVar29 = "ggml_type_size(src0->type) == sizeof(float)";
      uVar33 = 0x9eb;
    }
    break;
  case GGML_TYPE_I64:
  case GGML_TYPE_F64:
  case GGML_TYPE_IQ1_M:
switchD_001385ad_caseD_1b:
    pgVar3 = dst->src[1];
    __n = ggml_type_size();
    uVar23 = (ulong)(uint)dst->op_params[0];
    if (uVar23 < 4) {
      lVar36 = (long)params->nth;
      sVar4 = pgVar3->nb[0];
      sVar5 = pgVar3->nb[1];
      local_70 = (long)params->ith;
      local_40 = dst->ne[3];
      lVar24 = pgVar2->ne[0];
      sVar6 = pgVar3->nb[2];
      local_50 = pgVar3->nb[3];
      local_38 = pgVar2->nb[3];
      lVar8 = pgVar2->ne[1];
      lVar10 = dst->ne[0];
      lVar11 = dst->ne[1];
      lVar12 = pgVar2->ne[2];
      lVar13 = dst->ne[2];
      local_48 = dst->nb[3];
      lVar17 = pgVar2->ne[3];
      sVar7 = dst->nb[0];
      sVar9 = pgVar2->nb[0];
      sVar14 = dst->nb[1];
      sVar15 = pgVar2->nb[1];
      sVar16 = dst->nb[2];
      sVar18 = pgVar2->nb[2];
      local_98[0] = 0;
      local_98[1] = 0;
      local_98[2] = 0;
      local_98[3] = 0;
      local_98[uVar23] = pgVar2->ne[uVar23];
      lVar30 = local_98[2];
      lVar26 = local_98[1];
      lVar19 = local_98[0];
      if (local_40 < 1) {
        return;
      }
      local_148 = 0;
      local_68 = sVar16 * local_70;
      local_58 = local_98[3];
      local_60 = sVar18 * local_70;
      do {
        if (local_70 < lVar13) {
          lVar34 = (local_148 - local_58) * local_50;
          local_188 = local_68;
          local_190 = local_60;
          lVar25 = local_70;
          do {
            if (0 < lVar11) {
              lVar31 = 0;
              local_138 = local_188;
              local_180 = local_190;
              do {
                if (0 < lVar10) {
                  lVar32 = 0;
                  lVar35 = local_138;
                  lVar37 = local_180;
                  do {
                    if ((((lVar32 < lVar24) && (lVar31 < lVar8)) && (lVar25 < lVar12)) &&
                       (local_148 < lVar17)) {
                      __src = (void *)((long)pgVar2->data + lVar37);
                    }
                    else {
                      __src = (void *)((long)pgVar3->data +
                                      (lVar31 - lVar26) * sVar5 + (lVar25 - lVar30) * sVar6 + lVar34
                                      + (lVar32 - lVar19) * sVar4);
                    }
                    memcpy((void *)((long)dst->data + lVar35),__src,__n);
                    lVar37 = lVar37 + sVar9;
                    lVar35 = lVar35 + sVar7;
                    lVar32 = lVar32 + 1;
                  } while (lVar10 != lVar32);
                }
                lVar31 = lVar31 + 1;
                local_180 = local_180 + sVar15;
                local_138 = local_138 + sVar14;
              } while (lVar31 != lVar11);
            }
            lVar25 = lVar25 + lVar36;
            local_190 = local_190 + sVar18 * lVar36;
            local_188 = local_188 + sVar16 * lVar36;
          } while (lVar25 < lVar13);
        }
        local_60 = local_60 + local_38;
        local_68 = local_68 + local_48;
        local_148 = local_148 + 1;
      } while (local_148 != local_40);
      return;
    }
    pcVar29 = "dim >= 0 && dim < 4";
    uVar33 = 0x973;
    break;
  default:
    if (gVar1 == GGML_TYPE_F32) goto switchD_001385ad_caseD_1a;
    if (gVar1 != GGML_TYPE_F16) goto switchD_001385ad_caseD_1b;
  case GGML_TYPE_I16:
  case GGML_TYPE_BF16:
    pgVar3 = dst->src[1];
    lVar24 = ggml_type_size();
    if (lVar24 == 2) {
      uVar23 = (ulong)(uint)dst->op_params[0];
      if (uVar23 < 4) {
        lVar26 = (long)params->ith;
        lVar30 = (long)params->nth;
        lVar24 = dst->ne[0];
        sVar4 = dst->nb[0];
        sVar5 = pgVar3->nb[2];
        sVar6 = pgVar3->nb[1];
        sVar7 = pgVar2->nb[3];
        lVar8 = pgVar2->ne[3];
        sVar9 = pgVar2->nb[1];
        lVar10 = dst->ne[1];
        lVar11 = pgVar2->ne[0];
        lVar12 = pgVar2->ne[1];
        lVar13 = pgVar2->ne[2];
        sVar14 = pgVar2->nb[0];
        sVar15 = pgVar3->nb[0];
        sVar16 = pgVar3->nb[3];
        lVar17 = dst->ne[3];
        sVar18 = pgVar2->nb[2];
        lVar19 = dst->ne[2];
        sVar20 = dst->nb[1];
        sVar21 = dst->nb[2];
        sVar22 = dst->nb[3];
        local_98[0] = 0;
        local_98[1] = 0;
        local_98[2] = 0;
        local_98[3] = 0;
        local_98[uVar23] = pgVar2->ne[uVar23];
        if (0 < lVar17) {
          lVar36 = 0;
          local_190 = sVar21 * lVar26;
          local_188 = sVar18 * lVar26;
          do {
            if (lVar26 < lVar19) {
              local_180 = local_190;
              local_170 = local_188;
              lVar25 = lVar26;
              do {
                if (0 < lVar10) {
                  lVar34 = 0;
                  local_160 = local_180;
                  local_168 = local_170;
                  do {
                    if (0 < lVar24) {
                      lVar35 = 0;
                      puVar39 = (undefined2 *)((long)dst->data + local_160);
                      lVar31 = local_168;
                      do {
                        if (((lVar35 < lVar11) && (lVar34 < lVar12)) &&
                           ((lVar25 < lVar13 && (lVar36 < lVar8)))) {
                          puVar27 = (undefined2 *)((long)pgVar2->data + lVar31);
                        }
                        else {
                          puVar27 = (undefined2 *)
                                    ((long)pgVar3->data +
                                    (lVar34 - local_98[1]) * sVar6 + (lVar25 - local_98[2]) * sVar5
                                    + (lVar36 - local_98[3]) * sVar16 +
                                    (lVar35 - local_98[0]) * sVar15);
                        }
                        lVar35 = lVar35 + 1;
                        lVar31 = lVar31 + sVar14;
                        *puVar39 = *puVar27;
                        puVar39 = (undefined2 *)((long)puVar39 + sVar4);
                      } while (lVar24 != lVar35);
                    }
                    lVar34 = lVar34 + 1;
                    local_168 = local_168 + sVar9;
                    local_160 = local_160 + sVar20;
                  } while (lVar34 != lVar10);
                }
                lVar25 = lVar25 + lVar30;
                local_170 = local_170 + sVar18 * lVar30;
                local_180 = local_180 + sVar21 * lVar30;
              } while (lVar25 < lVar19);
            }
            lVar36 = lVar36 + 1;
            local_188 = local_188 + sVar7;
            local_190 = local_190 + sVar22;
          } while (lVar36 != lVar17);
        }
        return;
      }
      pcVar29 = "dim >= 0 && dim < 4";
      uVar33 = 0x9c9;
    }
    else {
      pcVar29 = "ggml_type_size(src0->type) == sizeof(ggml_fp16_t)";
      uVar33 = 0x9c0;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar33,"GGML_ASSERT(%s) failed",pcVar29);
}

Assistant:

void ggml_compute_forward_concat(
    const ggml_compute_params * params,
    ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F16:
        case GGML_TYPE_BF16:
        case GGML_TYPE_I16:
            {
                ggml_compute_forward_concat_f16(params, dst);
            } break;
        case GGML_TYPE_I8:
            {
                ggml_compute_forward_concat_i8(params, dst);
            } break;
        case GGML_TYPE_F32:
        case GGML_TYPE_I32:
            {
                ggml_compute_forward_concat_f32(params, dst);
            } break;
        default:
            {
                ggml_compute_forward_concat_any(params, dst);
            }
    }
}